

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xatlas.cpp
# Opt level: O1

AddMeshError xatlas::AddUvMesh(Atlas *atlas,UvMeshDecl *decl)

{
  float fVar1;
  uint32_t uVar2;
  IndexFormat IVar3;
  void *pvVar4;
  void *pvVar5;
  uint32_t *puVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  bool bVar9;
  int iVar10;
  undefined8 *puVar11;
  char *pcVar12;
  uint32_t i;
  long lVar13;
  AddMeshError AVar14;
  long lVar15;
  uint uVar16;
  uint uVar17;
  ulong uVar18;
  uint uVar19;
  uint32_t uVar20;
  ulong uVar21;
  long lVar22;
  bool bVar23;
  float fVar24;
  UvMesh *mesh;
  uint32_t tri [3];
  UvMeshInstance *meshInstance;
  uint local_5c;
  undefined8 *local_58;
  ulong local_50;
  uint local_48;
  uint local_44 [3];
  undefined8 *local_38;
  
  if (atlas == (Atlas *)0x0) {
    __assert_fail("atlas",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/vicfergar[P]XAtlasSharp/src/XAtlas/xatlas.cpp"
                  ,0x2431,"AddMeshError xatlas::AddUvMesh(Atlas *, const UvMeshDecl &)");
  }
  if (atlas[3].chartCount == 0) {
    uVar2 = decl->indexCount;
    uVar20 = decl->vertexCount;
    if (uVar2 != 0) {
      uVar20 = uVar2;
    }
    uVar21 = (ulong)uVar20;
    if ((internal::s_print != (undefined *)0x0) && (internal::s_printVerbose == '\x01')) {
      (*(code *)internal::s_print)
                ("Adding UV mesh %d: %u vertices, %u triangles\n",atlas[4].chartCount,
                 decl->vertexCount,uVar21 / 3);
    }
    AVar14 = InvalidIndexCount;
    if (uVar20 * -0x55555555 < 0x55555556) {
      if (uVar20 != 0 && uVar2 != 0) {
        pvVar4 = decl->indexData;
        if (pvVar4 == (void *)0x0) {
LAB_0010f1d0:
          __assert_fail("indexData",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/vicfergar[P]XAtlasSharp/src/XAtlas/xatlas.cpp"
                        ,0x233b,
                        "uint32_t xatlas::DecodeIndex(IndexFormat, const void *, int32_t, uint32_t)"
                       );
        }
        uVar18 = 0;
        do {
          if (decl->indexFormat == UInt16) {
            uVar19 = (uint)(ushort)(*(short *)((long)pvVar4 + uVar18 * 2) + (short)decl->indexOffset
                                   );
          }
          else {
            uVar19 = *(int *)((long)pvVar4 + uVar18 * 4) + decl->indexOffset;
          }
          if (decl->vertexCount <= uVar19) {
            return IndexOutOfRange;
          }
          uVar18 = uVar18 + 1;
        } while (uVar21 != uVar18);
      }
      local_50 = uVar21;
      local_48 = uVar20;
      puVar11 = (undefined8 *)(*(code *)internal::s_realloc)(0,0x20);
      if (puVar11 == (undefined8 *)0x0) {
LAB_0010f1ef:
        __assert_fail("size <= 0 || (size > 0 && mem)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/vicfergar[P]XAtlasSharp/src/XAtlas/xatlas.cpp"
                      ,0x1ae,
                      "void *xatlas::internal::Realloc(void *, size_t, int, const char *, int)");
      }
      puVar11[2] = 0;
      puVar11[3] = 0;
      *puVar11 = 0;
      puVar11[1] = 0;
      puVar11[2] = 8;
      *(undefined4 *)(puVar11 + 3) = 0;
      *puVar11 = 0;
      local_38 = puVar11;
      internal::ArrayBase::push_back((ArrayBase *)(atlas + 5),(uint8_t *)&local_38);
      local_58 = (undefined8 *)0x0;
      uVar19 = atlas[4].chartCount;
      if ((ulong)uVar19 != 0) {
        lVar15 = *(long *)&atlas[4].width;
        if (lVar15 == 0) {
          pcVar12 = 
          "T &xatlas::internal::Array<xatlas::internal::UvMesh *>::operator[](uint32_t) [T = xatlas::internal::UvMesh *]"
          ;
          goto LAB_0010f188;
        }
        uVar21 = 0;
        do {
          puVar11 = *(undefined8 **)(lVar15 + uVar21 * 8);
          iVar10 = bcmp(puVar11,decl,0x30);
          if (iVar10 == 0) {
            local_58 = puVar11;
            if ((internal::s_print != (undefined *)0x0) && (internal::s_printVerbose == '\x01')) {
              (*(code *)internal::s_print)("   instance of a previous UV mesh\n");
            }
            break;
          }
          uVar21 = uVar21 + 1;
        } while (uVar19 != uVar21);
      }
      if (local_58 == (undefined8 *)0x0) {
        puVar11 = (undefined8 *)(*(code *)internal::s_realloc)(0);
        if (puVar11 == (undefined8 *)0x0) goto LAB_0010f1ef;
        memset(puVar11,0,200);
        puVar11[8] = 4;
        *(undefined4 *)(puVar11 + 9) = 0;
        puVar11[10] = 0;
        puVar11[0xb] = 4;
        *(undefined4 *)(puVar11 + 0xc) = 0;
        puVar11[0xd] = 0;
        puVar11[0xe] = 4;
        *(undefined4 *)(puVar11 + 0xf) = 0;
        puVar11[0x10] = 0;
        puVar11[0x11] = 8;
        *(undefined4 *)(puVar11 + 0x12) = 0;
        puVar11[0x13] = 0;
        puVar11[0x14] = 8;
        *(undefined4 *)(puVar11 + 0x15) = 0;
        puVar11[0x16] = 0;
        puVar11[0x17] = 4;
        *(undefined4 *)(puVar11 + 0x18) = 0;
        local_58 = puVar11;
        internal::ArrayBase::push_back((ArrayBase *)&atlas[4].width,(uint8_t *)&local_58);
        uVar19 = local_48;
        uVar21 = local_50;
        pvVar4 = decl->vertexUvData;
        pvVar5 = decl->indexData;
        puVar6 = decl->faceMaterialData;
        uVar7 = *(undefined8 *)&decl->vertexCount;
        uVar8 = *(undefined8 *)&decl->indexOffset;
        *(undefined8 *)((long)local_58 + 0x1c) = *(undefined8 *)&decl->vertexStride;
        *(undefined8 *)((long)local_58 + 0x24) = uVar8;
        local_58[2] = puVar6;
        local_58[3] = uVar7;
        *local_58 = pvVar4;
        local_58[1] = pvVar5;
        if (decl->faceMaterialData != (uint32_t *)0x0) {
          uVar17 = decl->indexCount;
          uVar16 = uVar17 / 3;
          *(uint *)((long)local_58 + 0x5c) = uVar16;
          if (*(uint *)(local_58 + 0xc) < uVar16) {
            internal::ArrayBase::setArrayCapacity((ArrayBase *)(local_58 + 10),uVar17 / 3);
          }
          memcpy((void *)local_58[10],decl->faceMaterialData,
                 (ulong)*(uint *)((long)local_58 + 0x5c) << 2);
        }
        uVar17 = decl->indexCount;
        *(uint *)((long)local_58 + 0x74) = uVar17;
        if (*(uint *)(local_58 + 0xf) < uVar17) {
          internal::ArrayBase::setArrayCapacity((ArrayBase *)(local_58 + 0xd),uVar17);
        }
        if (uVar19 != 0) {
          pvVar4 = decl->indexData;
          IVar3 = decl->indexFormat;
          uVar18 = 0;
          do {
            if (uVar2 == 0) {
              uVar17 = (uint)uVar18;
            }
            else {
              if (pvVar4 == (void *)0x0) goto LAB_0010f1d0;
              if (IVar3 == UInt16) {
                uVar17 = (uint)(ushort)((short)decl->indexOffset +
                                       *(short *)((long)pvVar4 + uVar18 * 2));
              }
              else {
                uVar17 = decl->indexOffset + *(int *)((long)pvVar4 + uVar18 * 4);
              }
            }
            if (*(uint *)((long)local_58 + 0x74) <= uVar18) goto LAB_0010f192;
            if (local_58[0xd] == 0) goto LAB_0010f173;
            *(uint *)(local_58[0xd] + uVar18 * 4) = uVar17;
            uVar18 = uVar18 + 1;
          } while (uVar21 != uVar18);
        }
        uVar17 = decl->vertexCount;
        *(uint *)((long)local_58 + 0x8c) = uVar17;
        if (*(uint *)(local_58 + 0x12) < uVar17) {
          internal::ArrayBase::setArrayCapacity((ArrayBase *)(local_58 + 0x10),uVar17);
        }
        if (decl->vertexCount != 0) {
          uVar18 = 0;
          do {
            if (*(uint *)((long)local_58 + 0x8c) <= uVar18) goto LAB_0010f145;
            if (local_58[0x10] == 0) goto LAB_0010f15c;
            *(undefined8 *)(local_58[0x10] + uVar18 * 8) =
                 *(undefined8 *)
                  ((long)decl->vertexUvData + (ulong)(decl->vertexStride * (int)uVar18));
            uVar18 = uVar18 + 1;
          } while (uVar18 < decl->vertexCount);
        }
        uVar17 = decl->indexCount / 3;
        *(uint *)(local_58 + 6) = uVar17;
        uVar17 = uVar17 + 0x1f >> 5;
        *(uint *)((long)local_58 + 0x44) = uVar17;
        if (*(uint *)(local_58 + 9) < uVar17) {
          internal::ArrayBase::setArrayCapacity((ArrayBase *)(local_58 + 7),uVar17);
        }
        if (((void *)local_58[7] != (void *)0x0) && (*(int *)((long)local_58 + 0x44) != 0)) {
          memset((void *)local_58[7],0,
                 (ulong)(uint)(*(int *)((long)local_58 + 0x44) * *(int *)(local_58 + 8)));
        }
        local_5c = 0;
        if (2 < uVar19) {
          local_50 = uVar21 * 0xaaaaaaab >> 0x21;
          lVar15 = 0;
          lVar22 = 0;
          uVar21 = 0;
          local_5c = 0;
          do {
            uVar19 = *(uint *)((long)local_58 + 0x74);
            lVar13 = 0;
            do {
              if ((ulong)uVar19 <= (ulong)(lVar13 + lVar15)) goto LAB_0010f192;
              if (local_58[0xd] == 0) goto LAB_0010f173;
              local_44[lVar13] = *(uint *)(local_58[0xd] + lVar22 + lVar13 * 4);
              lVar13 = lVar13 + 1;
            } while (lVar13 != 3);
            bVar9 = false;
            uVar18 = 0;
            do {
              uVar19 = local_44[uVar18];
              if (*(uint *)((long)local_58 + 0x8c) <= uVar19) goto LAB_0010f145;
              lVar13 = local_58[0x10];
              if (lVar13 == 0) goto LAB_0010f15c;
              if ((NAN(*(float *)(lVar13 + (ulong)uVar19 * 8))) ||
                 (bVar23 = true, NAN(*(float *)(lVar13 + 4 + (ulong)uVar19 * 8)))) {
                local_5c = local_5c + 1;
                bVar9 = true;
                if ((internal::s_print == (undefined *)0x0 || 0x32 < local_5c) ||
                   (internal::s_printVerbose != '\x01')) {
                  bVar23 = false;
                }
                else {
                  bVar23 = false;
                  (*(code *)internal::s_print)("   NAN texture coordinate in vertex %u\n");
                }
              }
            } while ((bVar23) && (bVar23 = uVar18 < 2, uVar18 = uVar18 + 1, bVar23));
            if (!bVar9) {
              uVar19 = *(uint *)((long)local_58 + 0x8c);
              if (uVar19 <= local_44[0]) goto LAB_0010f145;
              lVar13 = local_58[0x10];
              if (lVar13 == 0) goto LAB_0010f15c;
              if ((uVar19 <= local_44[1]) || (uVar19 <= local_44[2])) goto LAB_0010f145;
              fVar24 = *(float *)(lVar13 + (ulong)local_44[0] * 8);
              fVar1 = *(float *)(lVar13 + 4 + (ulong)local_44[0] * 8);
              fVar24 = ABS(((*(float *)(lVar13 + 4 + (ulong)local_44[2] * 8) - fVar1) *
                            (*(float *)(lVar13 + (ulong)local_44[1] * 8) - fVar24) -
                           (*(float *)(lVar13 + 4 + (ulong)local_44[1] * 8) - fVar1) *
                           (*(float *)(lVar13 + (ulong)local_44[2] * 8) - fVar24)) * 0.5);
              if (fVar24 <= 1.1920929e-07) {
                local_5c = local_5c + 1;
                bVar9 = true;
                if ((internal::s_print != (undefined *)0x0 && local_5c < 0x33) &&
                   (internal::s_printVerbose == '\x01')) {
                  bVar9 = true;
                  (*(code *)internal::s_print)
                            (SUB84((double)fVar24,0),
                             "   Zero area face: %d, indices (%d %d %d), area is %f\n",
                             uVar21 & 0xffffffff);
                }
              }
            }
            if (bVar9) {
              internal::BitArray::set((BitArray *)(local_58 + 6),(uint32_t)uVar21);
            }
            uVar21 = uVar21 + 1;
            lVar22 = lVar22 + 0xc;
            lVar15 = lVar15 + 3;
          } while (uVar21 != local_50);
        }
        if ((0x32 < local_5c && internal::s_print != (undefined *)0x0) &&
           (internal::s_printVerbose == '\x01')) {
          (*(code *)internal::s_print)("   %u additional warnings truncated\n",local_5c - 0x32);
        }
      }
      *local_38 = local_58;
      AVar14 = Success;
    }
  }
  else {
    AVar14 = Error;
    if (internal::s_print != (undefined *)0x0) {
      (*(code *)internal::s_print)
                ("AddUvMesh: Meshes and UV meshes cannot be added to the same atlas.\n");
    }
  }
  return AVar14;
LAB_0010f192:
  pcVar12 = "T &xatlas::internal::Array<unsigned int>::operator[](uint32_t) [T = unsigned int]";
  goto LAB_0010f1a7;
LAB_0010f173:
  pcVar12 = "T &xatlas::internal::Array<unsigned int>::operator[](uint32_t) [T = unsigned int]";
  goto LAB_0010f188;
LAB_0010f15c:
  pcVar12 = 
  "T &xatlas::internal::Array<xatlas::internal::Vector2>::operator[](uint32_t) [T = xatlas::internal::Vector2]"
  ;
LAB_0010f188:
  __assert_fail("m_base.buffer",
                "/workspace/llm4binary/github/license_all_cmakelists_25/vicfergar[P]XAtlasSharp/src/XAtlas/xatlas.cpp"
                ,0x480,pcVar12);
LAB_0010f145:
  pcVar12 = 
  "T &xatlas::internal::Array<xatlas::internal::Vector2>::operator[](uint32_t) [T = xatlas::internal::Vector2]"
  ;
LAB_0010f1a7:
  __assert_fail("index < m_base.size",
                "/workspace/llm4binary/github/license_all_cmakelists_25/vicfergar[P]XAtlasSharp/src/XAtlas/xatlas.cpp"
                ,0x47f,pcVar12);
}

Assistant:

AddMeshError AddUvMesh(Atlas *atlas, const UvMeshDecl &decl)
{
	XA_DEBUG_ASSERT(atlas);
	if (!atlas) {
		XA_PRINT_WARNING("AddUvMesh: atlas is null.\n");
		return AddMeshError::Error;
	}
	Context *ctx = (Context *)atlas;
	if (!ctx->meshes.isEmpty()) {
		XA_PRINT_WARNING("AddUvMesh: Meshes and UV meshes cannot be added to the same atlas.\n");
		return AddMeshError::Error;
	}
#if XA_PROFILE
	if (ctx->uvMeshInstances.isEmpty())
		internal::s_profile.addMeshRealStart = std::chrono::high_resolution_clock::now();
#endif
	XA_PROFILE_START(addMeshCopyData)
	const bool hasIndices = decl.indexCount > 0;
	const uint32_t indexCount = hasIndices ? decl.indexCount : decl.vertexCount;
	XA_PRINT("Adding UV mesh %d: %u vertices, %u triangles\n", ctx->uvMeshes.size(), decl.vertexCount, indexCount / 3);
	// Expecting triangle faces.
	if ((indexCount % 3) != 0)
		return AddMeshError::InvalidIndexCount;
	if (hasIndices) {
		// Check if any index is out of range.
		for (uint32_t i = 0; i < indexCount; i++) {
			const uint32_t index = DecodeIndex(decl.indexFormat, decl.indexData, decl.indexOffset, i);
			if (index >= decl.vertexCount)
				return AddMeshError::IndexOutOfRange;
		}
	}
	// Create a mesh instance.
	internal::UvMeshInstance *meshInstance = XA_NEW(internal::MemTag::Default, internal::UvMeshInstance);
	meshInstance->mesh = nullptr;
	ctx->uvMeshInstances.push_back(meshInstance);
	// See if this is an instance of an already existing mesh.
	internal::UvMesh *mesh = nullptr;
	for (uint32_t m = 0; m < ctx->uvMeshes.size(); m++) {
		if (memcmp(&ctx->uvMeshes[m]->decl, &decl, sizeof(UvMeshDecl)) == 0) {
			mesh = ctx->uvMeshes[m];
			XA_PRINT("   instance of a previous UV mesh\n");
			break;
		}
	}
	if (!mesh) {
		// Copy geometry to mesh.
		mesh = XA_NEW(internal::MemTag::Default, internal::UvMesh);
		ctx->uvMeshes.push_back(mesh);
		mesh->decl = decl;
		if (decl.faceMaterialData) {
			mesh->faceMaterials.resize(decl.indexCount / 3);
			memcpy(mesh->faceMaterials.data(), decl.faceMaterialData, mesh->faceMaterials.size() * sizeof(uint32_t));
		}
		mesh->indices.resize(decl.indexCount);
		for (uint32_t i = 0; i < indexCount; i++)
			mesh->indices[i] = hasIndices ? DecodeIndex(decl.indexFormat, decl.indexData, decl.indexOffset, i) : i;
		mesh->texcoords.resize(decl.vertexCount);
		for (uint32_t i = 0; i < decl.vertexCount; i++)
			mesh->texcoords[i] = *((const internal::Vector2 *)&((const uint8_t *)decl.vertexUvData)[decl.vertexStride * i]);
		// Validate.
		mesh->faceIgnore.resize(decl.indexCount / 3);
		mesh->faceIgnore.zeroOutMemory();
		const uint32_t kMaxWarnings = 50;
		uint32_t warningCount = 0;
		for (uint32_t f = 0; f < indexCount / 3; f++) {
			bool ignore = false;
			uint32_t tri[3];
			for (uint32_t i = 0; i < 3; i++)
				tri[i] = mesh->indices[f * 3 + i];
			// Check for nan UVs.
			for (uint32_t i = 0; i < 3; i++) {
				const uint32_t vertex = tri[i];
				if (internal::isNan(mesh->texcoords[vertex].x) || internal::isNan(mesh->texcoords[vertex].y)) {
					ignore = true;
					if (++warningCount <= kMaxWarnings)
						XA_PRINT("   NAN texture coordinate in vertex %u\n", vertex);
					break;
				}
			}
			// Check for zero area faces.
			if (!ignore) {
				const internal::Vector2 &v1 = mesh->texcoords[tri[0]];
				const internal::Vector2 &v2 = mesh->texcoords[tri[1]];
				const internal::Vector2 &v3 = mesh->texcoords[tri[2]];
				const float area = fabsf(((v2.x - v1.x) * (v3.y - v1.y) - (v3.x - v1.x) * (v2.y - v1.y)) * 0.5f);
				if (area <= internal::kAreaEpsilon) {
					ignore = true;
					if (++warningCount <= kMaxWarnings)
						XA_PRINT("   Zero area face: %d, indices (%d %d %d), area is %f\n", f, tri[0], tri[1], tri[2], area);
				}
			}
			if (ignore)
				mesh->faceIgnore.set(f);
		}
		if (warningCount > kMaxWarnings)
			XA_PRINT("   %u additional warnings truncated\n", warningCount - kMaxWarnings);
	}
	meshInstance->mesh = mesh;
	XA_PROFILE_END(addMeshCopyData)
	return AddMeshError::Success;
}